

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,FixedArray<char,_1UL> *params,
          FixedArray<char,_1UL> *params_1,FixedArray<char,_1UL> *params_2)

{
  long lVar1;
  _ *p_Var2;
  size_t size;
  long local_38 [3];
  
  local_38[0] = 1;
  local_38[1] = 1;
  local_38[2] = 1;
  size = 0;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_38 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  heapString(__return_storage_ptr__,size);
  p_Var2 = (_ *)(__return_storage_ptr__->content).size_;
  if (p_Var2 != (_ *)0x0) {
    p_Var2 = (_ *)(__return_storage_ptr__->content).ptr;
  }
  *p_Var2 = *this;
  p_Var2[1] = (_)params->content[0];
  p_Var2[2] = (_)params_1->content[0];
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}